

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

Data * __thiscall
QUtcTimeZonePrivate::data(Data *__return_storage_ptr__,QUtcTimeZonePrivate *this,TimeType timeType)

{
  qint64 forMSecsSinceEpoch;
  
  forMSecsSinceEpoch = QDateTime::currentMSecsSinceEpoch();
  data(__return_storage_ptr__,this,forMSecsSinceEpoch);
  return __return_storage_ptr__;
}

Assistant:

QTimeZonePrivate::Data QUtcTimeZonePrivate::data(QTimeZone::TimeType timeType) const
{
    Q_UNUSED(timeType);
    return data(QDateTime::currentMSecsSinceEpoch());
}